

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l3.c
# Opt level: O2

int picnic3_l3_validate_keypair(picnic3_l3_privatekey_t *sk,picnic3_l3_publickey_t *pk)

{
  int iVar1;
  int iVar2;
  picnic_instance_t *lowmc;
  mzd_local_t plaintext [1];
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  uint8_t buffer [32];
  mzd_local_t mStack_e0;
  mzd_local_t local_c0;
  mzd_local_t local_a0;
  uint8_t local_80 [80];
  
  iVar2 = -1;
  if (pk != (picnic3_l3_publickey_t *)0x0 && sk != (picnic3_l3_privatekey_t *)0x0) {
    lowmc = picnic_instance_get(Picnic3_L3);
    iVar1 = bcmp(sk->data + 0x30,pk->data + 0x18,0x18);
    if (iVar1 == 0) {
      iVar1 = bcmp(sk->data + 0x18,pk,0x18);
      if (iVar1 == 0) {
        mzd_from_char_array(&mStack_e0,sk->data + 0x30,0x18);
        mzd_from_char_array(&local_a0,sk->data,0x18);
        lowmc_compute(&lowmc->lowmc,&local_a0,&mStack_e0,&local_c0);
        mzd_to_char_array(local_80,&local_c0,0x18);
        iVar2 = memcmp(local_80,pk,0x18);
      }
    }
  }
  return iVar2;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l3_validate_keypair(const picnic3_l3_privatekey_t* sk,
                                                            const picnic3_l3_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* pk_pt = PK_PT(pk);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (memcmp(sk_pt, pk_pt, LOWMC_BLOCK_SZ) != 0 || memcmp(sk_c, pk_c, LOWMC_BLOCK_SZ) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, LOWMC_BLOCK_SZ);

  return memcmp(buffer, pk_c, LOWMC_BLOCK_SZ);
}